

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robust_deserialization_unit.c
# Opt level: O0

void deserialize_bitset_incorrect_cardinality(void)

{
  uint8_t data [8201];
  uint8_t data_begin [9];
  undefined1 uVar1;
  undefined7 in_stack_ffffffffffffdff1;
  size_t in_stack_ffffffffffffdff8;
  void *in_stack_ffffffffffffe000;
  
  uVar1 = 0xff;
  memset(&stack0xffffffffffffdff1,0xff,0x2000);
  valid_deserialize_test(in_stack_ffffffffffffe000,in_stack_ffffffffffffdff8);
  invalid_deserialize_test
            (in_stack_ffffffffffffe000,in_stack_ffffffffffffdff8,
             (char *)CONCAT71(in_stack_ffffffffffffdff1,uVar1));
  return;
}

Assistant:

DEFINE_TEST(deserialize_bitset_incorrect_cardinality) {
    // clang-format off
    const uint8_t data_begin[] = {
        0x3B, 0x30, // Serial Cookie
        0, 0,       // Container count - 1
        0,          // Run Flag Bitset (no runs)
        0, 0,       // Upper 16 bits of the first container
        0xFF, 0xFF, // Cardinality - 1 of the first container.

        // First container is a bitset, should be followed by 1 << 16 bits
    };
    // clang-format on
    uint8_t data[sizeof(data_begin) + (1 << 16) / 8];

    memcpy(data, data_begin, sizeof(data_begin));
    memset(data + sizeof(data_begin), 0xFF, (1 << 16) / 8);

    valid_deserialize_test(data, sizeof(data));

    data[sizeof(data) - 1] = 0xFE;
    invalid_deserialize_test(data, sizeof(data),
                             "Incorrect bitset cardinality");
}